

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp sexp_type_slot_offset_op(sexp ctx,sexp self,sexp_sint_t n,sexp type,sexp slot)

{
  undefined1 auVar1 [16];
  sexp psVar2;
  int *in_RCX;
  sexp in_RDI;
  long in_R8;
  bool bVar3;
  int len;
  int offset;
  int i;
  sexp_conflict *v;
  sexp slots;
  sexp cpl;
  int local_60;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar4;
  undefined4 in_stack_ffffffffffffffb4;
  sexp in_stack_ffffffffffffffb8;
  int *piVar5;
  sexp in_stack_ffffffffffffffc0;
  int *piVar6;
  sexp local_8;
  
  if ((((ulong)in_RCX & 3) == 0) && (*in_RCX == 1)) {
    piVar6 = *(int **)(in_RCX + 4);
    if ((((ulong)piVar6 & 3) == 0) && (*piVar6 == 10)) {
      piVar5 = piVar6 + 4;
    }
    else {
      piVar5 = in_RCX + 6;
    }
    if ((((ulong)piVar6 & 3) == 0) && (*piVar6 == 10)) {
      local_60 = (int)*(undefined8 *)(piVar6 + 2);
    }
    else {
      local_60 = 1;
    }
    while (local_60 = local_60 + -1, -1 < local_60) {
      piVar6 = *(int **)(*(long *)(piVar5 + (long)local_60 * 2) + 0x18);
      iVar4 = 0;
      while( true ) {
        bVar3 = false;
        if (((ulong)piVar6 & 3) == 0) {
          bVar3 = *piVar6 == 6;
        }
        if (!bVar3) break;
        if (*(long *)(piVar6 + 2) == in_R8) {
          while (local_60 = local_60 + -1, -1 < local_60) {
            psVar2 = sexp_length_op(in_RDI,(sexp)0x0,1,
                                    *(sexp *)(*(long *)(piVar5 + (long)local_60 * 2) + 0x18));
            auVar1._8_8_ = (long)psVar2 >> 0x3f;
            auVar1._0_8_ = (ulong)psVar2 & 0xfffffffffffffffe;
            iVar4 = iVar4 + SUB164(auVar1 / SEXT816(2),0);
          }
          return (sexp)((long)iVar4 << 1 | 1);
        }
        piVar6 = *(int **)(piVar6 + 4);
        iVar4 = iVar4 + 1;
      }
    }
    local_8 = (sexp)&DAT_0000003e;
  }
  else {
    local_8 = sexp_type_exception(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                                  CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                                  (sexp)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8
                                                ));
  }
  return local_8;
}

Assistant:

sexp sexp_type_slot_offset_op (sexp ctx , sexp self, sexp_sint_t n, sexp type, sexp slot) {
  sexp cpl, slots, *v;
  int i, offset, len;
  sexp_assert_type(ctx, sexp_typep, SEXP_TYPE, type);
  cpl = sexp_type_cpl(type);
  if (sexp_vectorp(cpl)) {
    v = sexp_vector_data(cpl);
    len = sexp_vector_length(cpl);
  } else {
    v = &sexp_type_slots(type);
    len = 1;
  }
  len = sexp_vectorp(cpl) ? sexp_vector_length(cpl) : 1;
  for (i=len-1; i>=0; --i)
    for (slots=sexp_type_slots(v[i]), offset=0; sexp_pairp(slots); slots=sexp_cdr(slots), ++offset)
      if (sexp_car(slots) == slot) {
        while (--i>=0)
          offset += sexp_unbox_fixnum(sexp_length(ctx, sexp_type_slots(v[i])));
        return sexp_make_fixnum(offset);
      }
  return SEXP_FALSE;
}